

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Displacement.cpp
# Opt level: O0

Vector3d * __thiscall
OpenMD::DisplacementZ::calcCorrValImpl
          (DisplacementZ *this,int frame1,int frame2,int id1,int id2,int timeBin)

{
  reference pvVar1;
  reference pvVar2;
  reference pvVar3;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  Vector<double,_3U> *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  Vector3d diff;
  int zBin2;
  int zBin1;
  Vector<double,_3U> *in_stack_ffffffffffffff68;
  Vector<double,_3U> *v1;
  double local_78;
  Vector<double,_3U> local_70 [3];
  int local_28;
  value_type local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  v1 = in_RDI;
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  pvVar1 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)(in_RSI + 0xe58),(long)in_EDX);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](pvVar1,(long)local_1c);
  local_24 = *pvVar2;
  pvVar1 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)(in_RSI + 0xe58),(long)local_18);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](pvVar1,(long)local_20);
  local_28 = *pvVar2;
  if (local_24 == local_28) {
    pvVar3 = std::
             vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
             ::operator[]((vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                           *)(in_RSI + 0xe40),(long)local_18);
    in_stack_ffffffffffffff68 =
         &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
          operator[](pvVar3,(long)local_20)->super_Vector<double,_3U>;
    pvVar3 = std::
             vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
             ::operator[]((vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                           *)(in_RSI + 0xe40),(long)local_14);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              (pvVar3,(long)local_1c);
    OpenMD::operator-(v1,in_RDI);
    Vector3<double>::Vector3((Vector3<double> *)in_RDI,in_stack_ffffffffffffff68);
    pvVar3 = std::
             vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
             ::operator[]((vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                           *)(in_RSI + 0xe70),(long)in_stack_00000008);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              (pvVar3,(long)local_24);
    Vector<double,_3U>::operator+=(in_RDI,in_stack_ffffffffffffff68);
    pvVar1 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(in_RSI + 0xe88),(long)in_stack_00000008);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](pvVar1,(long)local_24);
    *pvVar2 = *pvVar2 + 1;
  }
  local_78 = 0.0;
  Vector<double,_3U>::Vector(local_70,&local_78);
  Vector3<double>::Vector3((Vector3<double> *)in_RDI,in_stack_ffffffffffffff68);
  return (Vector3d *)v1;
}

Assistant:

Vector3d DisplacementZ::calcCorrValImpl(int frame1, int frame2, int id1,
                                          int id2, int timeBin) {
    int zBin1 = zBins_[frame1][id1];
    int zBin2 = zBins_[frame2][id2];

    if (zBin1 == zBin2) {
      Vector3d diff = positions_[frame2][id2] - positions_[frame1][id1];
      histograms_[timeBin][zBin1] += diff;
      counts_[timeBin][zBin1]++;
    }
    return Vector3d(0.0);
  }